

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::analysis::TypeManager::GetTypeInstruction(TypeManager *this,Type *type)

{
  undefined8 *puVar1;
  array<signed_char,_4UL> *paVar2;
  uint32_t id_00;
  PodType PVar3;
  int iVar4;
  const_iterator cVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined8 *puVar6;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  IRContext *this_00;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  Op op;
  pointer *__ptr;
  array<signed_char,_4UL> *paVar7;
  long lVar8;
  IRContext *pIVar9;
  pointer *__ptr_2;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *pdVar10;
  pointer *__ptr_5;
  uint32_t id;
  size_type __dnew;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ops;
  string message;
  uint local_32c;
  undefined1 local_328 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_308;
  undefined1 local_2f8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_2d8;
  undefined1 local_2d0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_2b0;
  undefined1 local_2a8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_288;
  undefined1 local_280 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_260;
  undefined1 local_258 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_238;
  undefined8 *local_230;
  undefined1 local_228 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_208;
  int local_200;
  Op local_1fc;
  undefined1 local_1f8 [8];
  undefined1 auStack_1f0 [16];
  undefined1 local_1e0 [16];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_1d0;
  spv_operand_type_t local_1c8;
  undefined1 local_1c0 [32];
  _Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false> local_1a0;
  spv_operand_type_t local_198;
  SmallVector<unsigned_int,_2UL> local_190;
  float local_168;
  undefined1 local_160 [32];
  __node_base local_140;
  spv_operand_type_t local_138;
  undefined1 local_130 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_110;
  undefined4 local_108;
  SmallVector<unsigned_int,_2UL> local_100;
  undefined4 local_d8;
  SmallVector<unsigned_int,_2UL> local_d0;
  undefined4 local_a8;
  undefined1 local_a0 [24];
  _Base_ptr local_88;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  undefined8 local_78;
  initializer_list<spvtools::opt::Operand> local_70;
  undefined1 local_60 [24];
  _Base_ptr local_48;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_40;
  IRContext *local_38;
  undefined4 extraout_var_07;
  
  local_1f8 = (undefined1  [8])type;
  cVar5 = std::
          _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->type_to_id_)._M_h,(key_type *)local_1f8);
  if ((cVar5.
       super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
       ._M_cur != (__node_type *)0x0) &&
     (*(uint32_t *)
       ((long)cVar5.
              super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
              ._M_cur + 0x10) != 0)) {
    return *(uint32_t *)
            ((long)cVar5.
                   super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                   ._M_cur + 0x10);
  }
  local_32c = 0;
  pIVar9 = this->context_;
  id_00 = Module::TakeNextIdBound
                    ((pIVar9->module_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                     .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((id_00 == 0) && ((pIVar9->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_328._0_8_ = (spv_operand_table)0x25;
    local_1f8 = (undefined1  [8])(auStack_1f0 + 8);
    local_1f8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_1f8,(ulong)local_328);
    auStack_1f0._8_8_ = local_328._0_8_;
    *(undefined8 *)local_1f8 = 0x667265766f204449;
    ((spv_context)local_1f8)->opcode_table = (spv_opcode_table)0x797254202e776f6c;
    ((spv_context)local_1f8)->operand_table = (spv_operand_table)0x676e696e6e757220;
    ((spv_context)local_1f8)->ext_inst_table = (spv_ext_inst_table)0x746361706d6f6320;
    *(undefined8 *)((long)&((spv_context)local_1f8)->ext_inst_table + 5) = 0x2e7364692d746361;
    auStack_1f0._0_8_ = local_328._0_8_;
    *(char *)((long)&((spv_context)local_1f8)->target_env + local_328._0_8_) = '\0';
    local_328._0_8_ = (_func_int **)0x0;
    local_328._8_8_ = 0;
    local_328._16_4_ = (array<signed_char,_4UL>)0x0;
    local_328._20_4_ = (array<signed_char,_4UL>)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar9->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_328,(char *)local_1f8);
    if (local_1f8 == (undefined1  [8])(auStack_1f0 + 8)) {
      return 0;
    }
    operator_delete((void *)local_1f8,(ulong)((long)(uint32_t *)auStack_1f0._8_8_ + 1));
    return 0;
  }
  if (id_00 == 0) {
    return 0;
  }
  local_32c = id_00;
  RegisterType(this,id_00,type);
  switch(type->kind_) {
  case kVoid:
    local_2f8._0_8_ = this->context_;
    local_2a8._0_4_ = 0x13;
    break;
  case kBool:
    local_2f8._0_8_ = this->context_;
    local_2a8._0_4_ = 0x14;
    break;
  case kInteger:
    local_280._0_8_ = this->context_;
    local_258._0_4_ = 0x15;
    local_228._0_8_ = (ulong)(uint)local_228._4_4_ << 0x20;
    iVar4 = (*type->_vptr_Type[10])(type);
    local_328._24_8_ = local_328 + 0x10;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_08,iVar4) + 0x24))->_M_elems;
    local_328._8_8_ = 1;
    local_1f8._0_4_ = 6;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    auStack_1f0._8_8_ = (spv_operand_table)0x0;
    local_1e0._8_8_ = local_1e0;
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
               (SmallVector<unsigned_int,_2UL> *)local_328);
    iVar4 = (*type->_vptr_Type[10])(type);
    local_2f8._24_8_ = local_2f8 + 0x10;
    local_2f8._0_8_ = &PTR__SmallVector_00b02ef8;
    local_2d8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2f8._17_3_ = 0;
    local_2f8[0x10] = *(byte *)(CONCAT44(extraout_var_09,iVar4) + 0x28);
    local_2f8._8_8_ = (pointer)0x1;
    local_1c8 = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    local_1c0._0_8_ = &PTR__SmallVector_00b02ef8;
    local_1c0._8_8_ = 0;
    local_1c0._24_8_ = local_1c0 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_1a0;
    local_1a0._M_head_impl = (DefUseManager *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1c0,
               (SmallVector<unsigned_int,_2UL> *)local_2f8);
    local_2a8._8_8_ = 2;
    local_2a8._0_8_ = (IRContext *)local_1f8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2d0,(IRContext **)local_280,(Op *)local_258,(int *)local_228,
               &local_32c,(initializer_list<spvtools::opt::Operand> *)local_2a8);
    this_00 = (IRContext *)local_2d0._0_8_;
    local_2d0._0_8_ = (IRContext *)0x0;
    lVar8 = -0x60;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_00b02ef8;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0);
    local_2f8._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_2d8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_2d8,local_2d8._M_head_impl);
    }
    goto LAB_0050abcc;
  case kFloat:
    local_2d0._0_8_ = this->context_;
    local_280._0_4_ = 0x16;
    local_258._0_8_ = (ulong)(uint)local_258._4_4_ << 0x20;
    iVar4 = (*type->_vptr_Type[0xc])(type);
    local_328._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_11,iVar4) + 0x24))->_M_elems;
    local_1f8._0_4_ = 6;
    goto LAB_0050a5d0;
  case kVector:
    iVar4 = (*type->_vptr_Type[0xe])(type);
    local_328._16_4_ = GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_02,iVar4) + 0x28));
    if ((_Type)local_328._16_4_ == (_Type)0x0) {
      return 0;
    }
    local_280._0_8_ = this->context_;
    local_258._0_4_ = 0x17;
    local_228._0_8_ = (ulong)(uint)local_228._4_4_ << 0x20;
    local_328._24_8_ = local_328 + 0x10;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._8_8_ = 1;
    local_1f8._0_4_ = 1;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    auStack_1f0._8_8_ = (spv_operand_table)0x0;
    local_1e0._8_8_ = local_1e0;
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
               (SmallVector<unsigned_int,_2UL> *)local_328);
    iVar4 = (*type->_vptr_Type[0xe])(type);
    local_2f8._24_8_ = local_2f8 + 0x10;
    local_2f8._0_8_ = &PTR__SmallVector_00b02ef8;
    local_2d8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2f8._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_03,iVar4) + 0x30))->_M_elems;
    local_2f8._8_8_ = (pointer)0x1;
    local_1c8 = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    local_1c0._0_8_ = &PTR__SmallVector_00b02ef8;
    local_1c0._8_8_ = 0;
    local_1c0._24_8_ = local_1c0 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_1a0;
    local_1a0._M_head_impl = (DefUseManager *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1c0,
               (SmallVector<unsigned_int,_2UL> *)local_2f8);
    local_2a8._8_8_ = 2;
    local_2a8._0_8_ = (IRContext *)local_1f8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2d0,(IRContext **)local_280,(Op *)local_258,(int *)local_228,
               &local_32c,(initializer_list<spvtools::opt::Operand> *)local_2a8);
    this_00 = (IRContext *)local_2d0._0_8_;
    local_2d0._0_8_ = (IRContext *)0x0;
    lVar8 = -0x60;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_00b02ef8;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0);
    goto LAB_0050abae;
  case kMatrix:
    iVar4 = (*type->_vptr_Type[0x10])(type);
    local_328._16_4_ = GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_14,iVar4) + 0x28));
    if ((_Type)local_328._16_4_ == (_Type)0x0) {
      return 0;
    }
    local_280._0_8_ = this->context_;
    local_258._0_4_ = 0x18;
    local_228._0_8_ = (ulong)(uint)local_228._4_4_ << 0x20;
    local_328._24_8_ = local_328 + 0x10;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._8_8_ = 1;
    local_1f8._0_4_ = 1;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    auStack_1f0._8_8_ = (spv_operand_table)0x0;
    local_1e0._8_8_ = local_1e0;
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
               (SmallVector<unsigned_int,_2UL> *)local_328);
    iVar4 = (*type->_vptr_Type[0x10])(type);
    local_2f8._24_8_ = local_2f8 + 0x10;
    local_2f8._0_8_ = &PTR__SmallVector_00b02ef8;
    local_2d8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2f8._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_15,iVar4) + 0x30))->_M_elems;
    local_2f8._8_8_ = (pointer)0x1;
    local_1c8 = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    local_1c0._0_8_ = &PTR__SmallVector_00b02ef8;
    local_1c0._8_8_ = 0;
    local_1c0._24_8_ = local_1c0 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_1a0;
    local_1a0._M_head_impl = (DefUseManager *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1c0,
               (SmallVector<unsigned_int,_2UL> *)local_2f8);
    local_2a8._8_8_ = 2;
    local_2a8._0_8_ = (IRContext *)local_1f8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2d0,(IRContext **)local_280,(Op *)local_258,(int *)local_228,
               &local_32c,(initializer_list<spvtools::opt::Operand> *)local_2a8);
    this_00 = (IRContext *)local_2d0._0_8_;
    local_2d0._0_8_ = (IRContext *)0x0;
    lVar8 = -0x60;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_00b02ef8;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0);
    goto LAB_0050abae;
  case kImage:
    iVar4 = (*type->_vptr_Type[0x12])(type);
    puVar6 = (undefined8 *)CONCAT44(extraout_var_19,iVar4);
    local_328._16_4_ = GetTypeInstruction(this,(Type *)puVar6[5]);
    if ((_Type)local_328._16_4_ == (_Type)0x0) {
      return 0;
    }
    local_38 = this->context_;
    local_1fc = OpTypeImage;
    local_200 = 0;
    local_328._24_8_ = local_328 + 0x10;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._8_8_ = 1;
    local_1f8._0_4_ = 1;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    auStack_1f0._8_8_ = (spv_operand_table)0x0;
    local_1e0._8_8_ = local_1e0;
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
               (SmallVector<unsigned_int,_2UL> *)local_328);
    local_2f8._24_8_ = local_2f8 + 0x10;
    local_2f8._0_8_ = &PTR__SmallVector_00b02ef8;
    local_2d8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2f8._16_4_ = *&((array<signed_char,_4UL> *)(puVar6 + 6))->_M_elems;
    local_2f8._8_8_ = (pointer)0x1;
    local_1c8 = SPV_OPERAND_TYPE_DIMENSIONALITY;
    local_1c0._0_8_ = &PTR__SmallVector_00b02ef8;
    local_1c0._8_8_ = 0;
    local_1c0._24_8_ = local_1c0 + 0x10;
    local_1a0._M_head_impl = (DefUseManager *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1c0,
               (SmallVector<unsigned_int,_2UL> *)local_2f8);
    local_2a8._16_4_ = *(_Type *)((long)puVar6 + 0x34);
    local_2a8._24_8_ = local_2a8 + 0x10;
    local_2a8._0_8_ = &PTR__SmallVector_00b02ef8;
    local_288._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2a8._8_8_ = 1;
    local_198 = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    local_190._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00b02ef8;
    local_190.size_ = 0;
    local_190.small_data_ = (uint *)local_190.buffer;
    local_190.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_190,(SmallVector<unsigned_int,_2UL> *)local_2a8);
    local_2d0._24_8_ = local_2d0 + 0x10;
    local_2d0._0_8_ = &PTR__SmallVector_00b02ef8;
    local_2b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2d0[0x11] = '\0';
    local_2d0[0x12] = '\0';
    local_2d0[0x13] = '\0';
    local_2d0[0x10] = *(byte *)(puVar6 + 7);
    local_2d0._8_8_ = 1;
    local_168 = 8.40779e-45;
    local_160._0_8_ = &PTR__SmallVector_00b02ef8;
    local_160._8_8_ = (__node_base_ptr)0x0;
    local_160._24_8_ = local_160 + 0x10;
    local_140._M_nxt = (_Hash_node_base *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_160,
               (SmallVector<unsigned_int,_2UL> *)local_2d0);
    local_280._24_8_ = local_280 + 0x10;
    local_280._0_8_ = &PTR__SmallVector_00b02ef8;
    local_260._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_280[0x11] = '\0';
    local_280[0x12] = '\0';
    local_280[0x13] = '\0';
    local_280[0x10] = *(byte *)((long)puVar6 + 0x39);
    local_280._8_8_ = 1;
    local_138 = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    local_130._0_8_ = &PTR__SmallVector_00b02ef8;
    local_130._8_8_ = 0;
    local_130._24_8_ = local_130 + 0x10;
    local_110._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_130,
               (SmallVector<unsigned_int,_2UL> *)local_280);
    local_258._16_4_ = *(_Type *)((long)puVar6 + 0x3c);
    local_258._24_8_ = local_258 + 0x10;
    local_258._0_8_ = &PTR__SmallVector_00b02ef8;
    local_238._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_258._8_8_ = 1;
    local_108 = 6;
    local_100._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00b02ef8;
    local_100.size_ = 0;
    local_100.small_data_ = (uint *)local_100.buffer;
    local_100.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_230 = puVar6;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_100,(SmallVector<unsigned_int,_2UL> *)local_258);
    local_228._16_4_ = *(_Type *)(puVar6 + 8);
    local_228._24_8_ = local_228 + 0x10;
    local_228._0_8_ = &PTR__SmallVector_00b02ef8;
    local_208._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_228._8_8_ = 1;
    local_d8 = 0x15;
    local_d0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00b02ef8;
    local_d0.size_ = 0;
    local_d0.small_data_ = (uint *)local_d0.buffer;
    local_d0.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_d0,(SmallVector<unsigned_int,_2UL> *)local_228);
    local_60._16_4_ = *(_Type *)((long)local_230 + 0x44);
    local_48 = (_Base_ptr)(local_60 + 0x10);
    local_60._0_8_ = &PTR__SmallVector_00b02ef8;
    local_40._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_60._8_8_ = (_Base_ptr)0x1;
    local_a8 = 0x1a;
    local_a0._0_8_ = &PTR__SmallVector_00b02ef8;
    local_a0._8_8_ = 0;
    local_88 = (_Base_ptr)(local_a0 + 0x10);
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_80
    ;
    local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_a0,(SmallVector<unsigned_int,_2UL> *)local_60
              );
    local_70._M_len = 8;
    local_70._M_array = (iterator)local_1f8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_78,&local_38,&local_1fc,&local_200,&local_32c,&local_70);
    this_00 = local_78;
    local_78 = (IRContext *)0x0;
    lVar8 = -0x180;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_00b02ef8;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0);
    local_60._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_40._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_40,local_40._M_head_impl);
    }
    local_228._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_208._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_208,local_208._M_head_impl);
    }
    local_258._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_238._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_238,local_238._M_head_impl);
    }
    goto LAB_0050ab4b;
  case kSampler:
    local_2f8._0_8_ = this->context_;
    local_2a8._0_4_ = 0x1a;
    break;
  case kSampledImage:
    iVar4 = (*type->_vptr_Type[0x16])(type);
    local_328._16_4_ = GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_21,iVar4) + 0x28));
    if ((_Type)local_328._16_4_ == (_Type)0x0) {
      return 0;
    }
    local_2d0._0_8_ = this->context_;
    local_280._0_4_ = 0x1b;
    goto LAB_0050a58d;
  case kArray:
    iVar4 = (*type->_vptr_Type[0x18])(type);
    local_328._16_4_ = GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_05,iVar4) + 0x28));
    if ((_Type)local_328._16_4_ == (_Type)0x0) {
      return 0;
    }
    local_280._0_8_ = this->context_;
    local_258._0_4_ = 0x1c;
    local_228._0_8_ = (ulong)(uint)local_228._4_4_ << 0x20;
    local_328._24_8_ = local_328 + 0x10;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._8_8_ = 1;
    local_1f8._0_4_ = 1;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    auStack_1f0._8_8_ = (spv_operand_table)0x0;
    local_1e0._8_8_ = local_1e0;
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
               (SmallVector<unsigned_int,_2UL> *)local_328);
    iVar4 = (*type->_vptr_Type[0x18])(type);
    local_2f8._24_8_ = local_2f8 + 0x10;
    local_2f8._0_8_ = &PTR__SmallVector_00b02ef8;
    local_2d8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2f8._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_06,iVar4) + 0x30))->_M_elems;
    local_2f8._8_8_ = (pointer)0x1;
    local_1c8 = SPV_OPERAND_TYPE_ID;
    local_1c0._0_8_ = &PTR__SmallVector_00b02ef8;
    local_1c0._8_8_ = 0;
    local_1c0._24_8_ = local_1c0 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_1a0;
    local_1a0._M_head_impl = (DefUseManager *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1c0,
               (SmallVector<unsigned_int,_2UL> *)local_2f8);
    local_2a8._8_8_ = 2;
    local_2a8._0_8_ = (IRContext *)local_1f8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2d0,(IRContext **)local_280,(Op *)local_258,(int *)local_228,
               &local_32c,(initializer_list<spvtools::opt::Operand> *)local_2a8);
    this_00 = (IRContext *)local_2d0._0_8_;
    local_2d0._0_8_ = (IRContext *)0x0;
    lVar8 = -0x60;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_00b02ef8;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0);
    goto LAB_0050abae;
  case kRuntimeArray:
    iVar4 = (*type->_vptr_Type[0x1a])(type);
    local_328._16_4_ = GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_20,iVar4) + 0x28));
    if ((_Type)local_328._16_4_ == (_Type)0x0) {
      return 0;
    }
    local_2d0._0_8_ = this->context_;
    local_280._0_4_ = 0x1d;
    goto LAB_0050a58d;
  case kNodePayloadArrayAMDX:
    iVar4 = (*type->_vptr_Type[0x1c])(type);
    local_328._16_4_ = GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_01,iVar4) + 0x28));
    if ((_Type)local_328._16_4_ == (_Type)0x0) {
      return 0;
    }
    local_2d0._0_8_ = this->context_;
    local_280._0_4_ = 0x13d4;
LAB_0050a58d:
    local_258._0_8_ = (ulong)(uint)local_258._4_4_ << 0x20;
    local_1f8._0_4_ = 1;
LAB_0050a5d0:
    local_328._24_8_ = local_328 + 0x10;
    local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._8_8_ = 1;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    auStack_1f0._8_8_ = (spv_operand_table)0x0;
    local_1e0._8_8_ = local_1e0;
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
               (SmallVector<unsigned_int,_2UL> *)local_328);
    local_2f8._8_8_ = (pointer)0x1;
    local_2f8._0_8_ = (IRContext *)local_1f8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2a8,(IRContext **)local_2d0,(Op *)local_280,(int *)local_258,
               &local_32c,(initializer_list<spvtools::opt::Operand> *)local_2f8);
    this_00 = (IRContext *)local_2a8._0_8_;
    local_2a8._0_8_ = (IRContext *)0x0;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_1d0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_1d0,local_1d0._M_head_impl);
    }
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    goto LAB_0050abcc;
  case kStruct:
    local_2f8._0_8_ = (IRContext *)0x0;
    local_2f8._8_8_ = (pointer)0x0;
    local_2f8._16_4_ = (array<signed_char,_4UL>)0x0;
    local_2f8._20_4_ = (array<signed_char,_4UL>)0x0;
    iVar4 = (*type->_vptr_Type[0x1e])(type);
    puVar1 = *(undefined8 **)(CONCAT44(extraout_var_04,iVar4) + 0x30);
    for (puVar6 = *(undefined8 **)(CONCAT44(extraout_var_04,iVar4) + 0x28); puVar6 != puVar1;
        puVar6 = puVar6 + 1) {
      PVar3.data._M_elems = (array<signed_char,_4UL>)GetTypeInstruction(this,(Type *)*puVar6);
      if (PVar3.data._M_elems == (_Type)0x0) {
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_2f8);
        return 0;
      }
      local_328._0_8_ = &PTR__SmallVector_00b02ef8;
      local_328._24_8_ = local_328 + 0x10;
      local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_328._16_4_ = PVar3.data._M_elems;
      local_328._8_8_ = 1;
      local_1f8._0_4_ = 1;
      auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
      auStack_1f0._8_8_ = (spv_operand_table)0x0;
      local_1e0._8_8_ = local_1e0;
      local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
                 (SmallVector<unsigned_int,_2UL> *)local_328);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 local_2f8,(Operand *)local_1f8);
      auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_1d0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_1d0,local_1d0._M_head_impl);
      }
      local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_328._0_8_ = &PTR__SmallVector_00b02ef8;
      if (local_308._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_308,local_308._M_head_impl);
      }
    }
    pIVar9 = this->context_;
    this_00 = (IRContext *)operator_new(0x70);
    op = OpTypeStruct;
    goto LAB_00509ba2;
  case kOpaque:
    iVar4 = (*type->_vptr_Type[0x20])(type);
    utils::MakeVector((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2f8,
                      (string *)(CONCAT44(extraout_var_18,iVar4) + 0x28));
    local_280._0_8_ = this->context_;
    local_258._0_4_ = 0x1f;
    local_228._0_8_ = (ulong)(uint)local_228._4_4_ << 0x20;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)local_328,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2f8);
    local_1f8._0_4_ = 0xb;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    auStack_1f0._8_8_ = (spv_operand_table)0x0;
    local_1e0._8_8_ = local_1e0;
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
               (SmallVector<unsigned_int,_2UL> *)local_328);
    local_2a8._8_8_ = 1;
    local_2a8._0_8_ = (IRContext *)local_1f8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2d0,(IRContext **)local_280,(Op *)local_258,(int *)local_228,
               &local_32c,(initializer_list<spvtools::opt::Operand> *)local_2a8);
    this_00 = (IRContext *)local_2d0._0_8_;
    local_2d0._0_8_ = (IRContext *)0x0;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_1d0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_1d0,local_1d0._M_head_impl);
    }
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_308._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_308,local_308._M_head_impl);
    }
    if ((IRContext *)local_2f8._0_8_ != (IRContext *)0x0) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ - local_2f8._0_8_);
    }
    goto LAB_0050abe0;
  case kPointer:
    iVar4 = (*type->_vptr_Type[0x22])(type);
    local_2f8._16_4_ = GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_00,iVar4) + 0x28));
    if ((_Type)local_2f8._16_4_ == (_Type)0x0) {
      return 0;
    }
    local_280._0_8_ = this->context_;
    local_258._0_4_ = 0x20;
    local_228._0_8_ = (ulong)(uint)local_228._4_4_ << 0x20;
    local_328._24_8_ = local_328 + 0x10;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_00,iVar4) + 0x30))->_M_elems;
    local_328._8_8_ = 1;
    local_1f8._0_4_ = 0x11;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    auStack_1f0._8_8_ = (spv_operand_table)0x0;
    local_1e0._8_8_ = local_1e0;
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
               (SmallVector<unsigned_int,_2UL> *)local_328);
    local_2f8._24_8_ = local_2f8 + 0x10;
    local_2f8._0_8_ = &PTR__SmallVector_00b02ef8;
    local_2d8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2f8._8_8_ = (pointer)0x1;
    local_1c8 = SPV_OPERAND_TYPE_ID;
    local_1c0._0_8_ = &PTR__SmallVector_00b02ef8;
    local_1c0._8_8_ = 0;
    local_1c0._24_8_ = local_1c0 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_1a0;
    local_1a0._M_head_impl = (DefUseManager *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1c0,
               (SmallVector<unsigned_int,_2UL> *)local_2f8);
    local_2a8._8_8_ = 2;
    local_2a8._0_8_ = (IRContext *)local_1f8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2d0,(IRContext **)local_280,(Op *)local_258,(int *)local_228,
               &local_32c,(initializer_list<spvtools::opt::Operand> *)local_2a8);
    this_00 = (IRContext *)local_2d0._0_8_;
    local_2d0._0_8_ = (IRContext *)0x0;
    lVar8 = -0x60;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_00b02ef8;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0);
    goto LAB_0050abae;
  case kFunction:
    local_2f8._0_8_ = (IRContext *)0x0;
    local_2f8._8_8_ = (pointer)0x0;
    local_2f8._16_4_ = (array<signed_char,_4UL>)0x0;
    local_2f8._20_4_ = (array<signed_char,_4UL>)0x0;
    iVar4 = (*type->_vptr_Type[0x24])(type);
    lVar8 = CONCAT44(extraout_var_10,iVar4);
    PVar3.data._M_elems = (array<signed_char,_4UL>)GetTypeInstruction(this,*(Type **)(lVar8 + 0x28))
    ;
    if (PVar3.data._M_elems == (_Type)0x0) {
LAB_0050ac61:
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 local_2f8);
      return 0;
    }
    local_328._24_8_ = local_328 + 0x10;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._16_4_ = PVar3.data._M_elems;
    local_328._8_8_ = 1;
    local_1f8._0_4_ = 1;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    auStack_1f0._8_8_ = (spv_operand_table)0x0;
    local_1e0._8_8_ = local_1e0;
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
               (SmallVector<unsigned_int,_2UL> *)local_328);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_2f8,
               (Operand *)local_1f8);
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_1d0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_1d0,local_1d0._M_head_impl);
    }
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_308._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_308,local_308._M_head_impl);
    }
    puVar6 = *(undefined8 **)(lVar8 + 0x30);
    local_230 = *(undefined8 **)(lVar8 + 0x38);
    if (puVar6 != local_230) {
      do {
        PVar3.data._M_elems = (array<signed_char,_4UL>)GetTypeInstruction(this,(Type *)*puVar6);
        if (PVar3.data._M_elems == (_Type)0x0) goto LAB_0050ac61;
        local_328._0_8_ = &PTR__SmallVector_00b02ef8;
        local_328._24_8_ = local_328 + 0x10;
        local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_328._16_4_ = PVar3.data._M_elems;
        local_328._8_8_ = 1;
        local_1f8._0_4_ = 1;
        auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
        auStack_1f0._8_8_ = (spv_operand_table)0x0;
        local_1e0._8_8_ = local_1e0;
        local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
                   (SmallVector<unsigned_int,_2UL> *)local_328);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_2f8,(Operand *)local_1f8);
        auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
        if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )local_1d0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
        {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_1d0,local_1d0._M_head_impl);
        }
        local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_328._0_8_ = &PTR__SmallVector_00b02ef8;
        if (local_308._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_308,local_308._M_head_impl);
        }
        puVar6 = puVar6 + 1;
      } while (puVar6 != local_230);
    }
    pIVar9 = this->context_;
    this_00 = (IRContext *)operator_new(0x70);
    op = OpTypeFunction;
    goto LAB_00509ba2;
  case kEvent:
    local_2f8._0_8_ = this->context_;
    local_2a8._0_4_ = 0x22;
    break;
  case kDeviceEvent:
    local_2f8._0_8_ = this->context_;
    local_2a8._0_4_ = 0x23;
    break;
  case kReserveId:
    local_2f8._0_8_ = this->context_;
    local_2a8._0_4_ = 0x24;
    break;
  case kQueue:
    local_2f8._0_8_ = this->context_;
    local_2a8._0_4_ = 0x25;
    break;
  case kPipe:
    local_2d0._0_8_ = this->context_;
    local_280._0_4_ = 0x26;
    local_258._0_8_ = (ulong)(uint)local_258._4_4_ << 0x20;
    iVar4 = (*type->_vptr_Type[0x2e])(type);
    local_328._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_13,iVar4) + 0x24))->_M_elems;
    local_1f8._0_4_ = 0x1a;
    goto LAB_0050a5d0;
  case kForwardPointer:
    local_280._0_8_ = this->context_;
    local_258._0_4_ = 0x27;
    local_228._0_8_ = (ulong)(uint)local_228._4_4_ << 0x20;
    local_60._0_8_ = local_60._0_8_ & 0xffffffff00000000;
    iVar4 = (*type->_vptr_Type[0x30])(type);
    local_328._24_8_ = local_328 + 0x10;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_16,iVar4) + 0x24))->_M_elems;
    local_328._8_8_ = 1;
    local_1f8._0_4_ = 1;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    auStack_1f0._8_8_ = (spv_operand_table)0x0;
    local_1e0._8_8_ = local_1e0;
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
               (SmallVector<unsigned_int,_2UL> *)local_328);
    iVar4 = (*type->_vptr_Type[0x30])(type);
    local_2f8._24_8_ = local_2f8 + 0x10;
    local_2f8._0_8_ = &PTR__SmallVector_00b02ef8;
    local_2d8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2f8._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_17,iVar4) + 0x28))->_M_elems;
    local_2f8._8_8_ = (pointer)0x1;
    local_1c8 = SPV_OPERAND_TYPE_STORAGE_CLASS;
    local_1c0._0_8_ = &PTR__SmallVector_00b02ef8;
    local_1c0._8_8_ = 0;
    local_1c0._24_8_ = local_1c0 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_1a0;
    local_1a0._M_head_impl = (DefUseManager *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1c0,
               (SmallVector<unsigned_int,_2UL> *)local_2f8);
    local_2a8._8_8_ = 2;
    local_2a8._0_8_ = (IRContext *)local_1f8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2d0,(IRContext **)local_280,(Op *)local_258,(int *)local_228,
               (int *)local_60,(initializer_list<spvtools::opt::Operand> *)local_2a8);
    this_00 = (IRContext *)local_2d0._0_8_;
    local_2d0._0_8_ = (IRContext *)0x0;
    lVar8 = -0x60;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_00b02ef8;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0);
    goto LAB_0050abae;
  case kPipeStorage:
    local_2f8._0_8_ = this->context_;
    local_2a8._0_4_ = 0x142;
    break;
  case kNamedBarrier:
    local_2f8._0_8_ = this->context_;
    local_2a8._0_4_ = 0x147;
    break;
  case kAccelerationStructureNV:
    local_2f8._0_8_ = this->context_;
    local_2a8._0_4_ = 0x14dd;
    break;
  case kCooperativeMatrixNV:
    iVar4 = (*type->_vptr_Type[0x38])(type);
    puVar6 = (undefined8 *)CONCAT44(extraout_var_07,iVar4);
    local_328._16_4_ = GetTypeInstruction(this,(Type *)puVar6[5]);
    if ((_Type)local_328._16_4_ == (_Type)0x0) {
      return 0;
    }
    local_228._0_8_ = this->context_;
    local_60._0_4_ = 0x14ee;
    local_70._M_array = (iterator)((ulong)local_70._M_array._4_4_ << 0x20);
    local_328._24_8_ = local_328 + 0x10;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._8_8_ = 1;
    local_1f8._0_4_ = 1;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    auStack_1f0._8_8_ = (spv_operand_table)0x0;
    local_1e0._8_8_ = local_1e0;
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
               (SmallVector<unsigned_int,_2UL> *)local_328);
    local_2f8._24_8_ = local_2f8 + 0x10;
    local_2f8._0_8_ = &PTR__SmallVector_00b02ef8;
    local_2d8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2f8._16_4_ = *&((array<signed_char,_4UL> *)(puVar6 + 6))->_M_elems;
    local_2f8._8_8_ = (pointer)0x1;
    local_1c8 = SPV_OPERAND_TYPE_SCOPE_ID;
    local_1c0._0_8_ = &PTR__SmallVector_00b02ef8;
    local_1c0._8_8_ = 0;
    local_1c0._24_8_ = local_1c0 + 0x10;
    local_1a0._M_head_impl = (DefUseManager *)0x0;
    local_230 = puVar6;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1c0,
               (SmallVector<unsigned_int,_2UL> *)local_2f8);
    local_2a8._16_4_ = *(_Type *)((long)puVar6 + 0x34);
    local_2a8._24_8_ = local_2a8 + 0x10;
    local_2a8._0_8_ = &PTR__SmallVector_00b02ef8;
    local_288._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2a8._8_8_ = 1;
    local_198 = SPV_OPERAND_TYPE_ID;
    local_190._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00b02ef8;
    local_190.size_ = 0;
    local_190.small_data_ = (uint *)local_190.buffer;
    local_190.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_190,(SmallVector<unsigned_int,_2UL> *)local_2a8);
    local_2d0._16_4_ = *(_Type *)(local_230 + 7);
    local_2d0._24_8_ = local_2d0 + 0x10;
    local_2d0._0_8_ = &PTR__SmallVector_00b02ef8;
    local_2b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2d0._8_8_ = 1;
    local_168 = 1.4013e-45;
    local_160._0_8_ = &PTR__SmallVector_00b02ef8;
    local_160._8_8_ = (__node_base_ptr)0x0;
    local_160._24_8_ = local_160 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_140;
    local_140._M_nxt = (_Hash_node_base *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_160,
               (SmallVector<unsigned_int,_2UL> *)local_2d0);
    local_280._8_8_ = 4;
    local_280._0_8_ = (IRContext *)local_1f8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_258,(IRContext **)local_228,(Op *)local_60,(int *)&local_70,
               &local_32c,(initializer_list<spvtools::opt::Operand> *)local_280);
    this_00 = (IRContext *)local_258._0_8_;
    local_258._0_8_ = (IRContext *)0x0;
    lVar8 = -0xc0;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_00b02ef8;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0);
    goto LAB_0050ab6d;
  case kCooperativeMatrixKHR:
    iVar4 = (*type->_vptr_Type[0x3a])(type);
    lVar8 = CONCAT44(extraout_var_23,iVar4);
    local_328._16_4_ = GetTypeInstruction(this,*(Type **)(lVar8 + 0x28));
    if ((_Type)local_328._16_4_ == (_Type)0x0) {
      return 0;
    }
    local_60._0_8_ = this->context_;
    local_70._M_array = (iterator)CONCAT44(local_70._M_array._4_4_,0x1168);
    local_78 = (IRContext *)((ulong)local_78._4_4_ << 0x20);
    local_328._24_8_ = local_328 + 0x10;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._8_8_ = 1;
    local_1f8._0_4_ = 1;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    auStack_1f0._8_8_ = (spv_operand_table)0x0;
    local_1e0._8_8_ = local_1e0;
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
               (SmallVector<unsigned_int,_2UL> *)local_328);
    local_2f8._24_8_ = local_2f8 + 0x10;
    local_2f8._0_8_ = &PTR__SmallVector_00b02ef8;
    local_2d8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2f8._16_4_ = *&((array<signed_char,_4UL> *)(lVar8 + 0x30))->_M_elems;
    local_2f8._8_8_ = (pointer)0x1;
    local_1c8 = SPV_OPERAND_TYPE_SCOPE_ID;
    local_1c0._0_8_ = &PTR__SmallVector_00b02ef8;
    local_1c0._8_8_ = 0;
    local_1c0._24_8_ = local_1c0 + 0x10;
    local_1a0._M_head_impl = (DefUseManager *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1c0,
               (SmallVector<unsigned_int,_2UL> *)local_2f8);
    local_2a8._16_4_ = *(_Type *)(lVar8 + 0x34);
    local_2a8._24_8_ = local_2a8 + 0x10;
    local_2a8._0_8_ = &PTR__SmallVector_00b02ef8;
    local_288._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2a8._8_8_ = 1;
    local_198 = SPV_OPERAND_TYPE_ID;
    local_190._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00b02ef8;
    local_190.size_ = 0;
    local_190.small_data_ = (uint *)local_190.buffer;
    local_190.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_190,(SmallVector<unsigned_int,_2UL> *)local_2a8);
    local_2d0._16_4_ = *(_Type *)(lVar8 + 0x38);
    local_2d0._24_8_ = local_2d0 + 0x10;
    local_2d0._0_8_ = &PTR__SmallVector_00b02ef8;
    local_2b0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2d0._8_8_ = 1;
    local_168 = 1.4013e-45;
    local_160._0_8_ = &PTR__SmallVector_00b02ef8;
    local_160._8_8_ = (__node_base_ptr)0x0;
    local_160._24_8_ = local_160 + 0x10;
    local_140._M_nxt = (_Hash_node_base *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_160,
               (SmallVector<unsigned_int,_2UL> *)local_2d0);
    local_280._16_4_ = *(_Type *)(lVar8 + 0x3c);
    local_280._24_8_ = local_280 + 0x10;
    local_280._0_8_ = &PTR__SmallVector_00b02ef8;
    local_260._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_280._8_8_ = 1;
    local_138 = SPV_OPERAND_TYPE_ID;
    local_130._0_8_ = &PTR__SmallVector_00b02ef8;
    local_130._8_8_ = 0;
    local_130._24_8_ = local_130 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_110;
    local_110._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_130,
               (SmallVector<unsigned_int,_2UL> *)local_280);
    local_258._8_8_ = 5;
    local_258._0_8_ = (IRContext *)local_1f8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_228,(IRContext **)local_60,(Op *)&local_70,(int *)&local_78,
               &local_32c,(initializer_list<spvtools::opt::Operand> *)local_258);
    this_00 = (IRContext *)local_228._0_8_;
    local_228._0_8_ = (IRContext *)0x0;
    lVar8 = -0xf0;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_00b02ef8;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0);
LAB_0050ab4b:
    local_280._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_260._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_260,local_260._M_head_impl);
    }
LAB_0050ab6d:
    local_2d0._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_2b0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_2b0,local_2b0._M_head_impl);
    }
    local_2a8._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_288._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_288,local_288._M_head_impl);
    }
    goto LAB_0050abae;
  case kCooperativeVectorNV:
    iVar4 = (*type->_vptr_Type[0x3c])(type);
    local_328._16_4_ = GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var,iVar4) + 0x28));
    if ((_Type)local_328._16_4_ == (_Type)0x0) {
      return 0;
    }
    local_280._0_8_ = this->context_;
    local_258._0_4_ = 0x14a8;
    local_228._0_8_ = (ulong)(uint)local_228._4_4_ << 0x20;
    local_328._24_8_ = local_328 + 0x10;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._8_8_ = 1;
    local_1f8._0_4_ = 1;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    auStack_1f0._8_8_ = (spv_operand_table)0x0;
    local_1e0._8_8_ = local_1e0;
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
               (SmallVector<unsigned_int,_2UL> *)local_328);
    local_2f8._24_8_ = local_2f8 + 0x10;
    local_2f8._0_8_ = &PTR__SmallVector_00b02ef8;
    local_2d8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2f8._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var,iVar4) + 0x30))->_M_elems;
    local_2f8._8_8_ = (pointer)0x1;
    local_1c8 = SPV_OPERAND_TYPE_ID;
    local_1c0._0_8_ = &PTR__SmallVector_00b02ef8;
    local_1c0._8_8_ = 0;
    local_1c0._24_8_ = local_1c0 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_1a0;
    local_1a0._M_head_impl = (DefUseManager *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1c0,
               (SmallVector<unsigned_int,_2UL> *)local_2f8);
    local_2a8._8_8_ = 2;
    local_2a8._0_8_ = (IRContext *)local_1f8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2d0,(IRContext **)local_280,(Op *)local_258,(int *)local_228,
               &local_32c,(initializer_list<spvtools::opt::Operand> *)local_2a8);
    this_00 = (IRContext *)local_2d0._0_8_;
    local_2d0._0_8_ = (IRContext *)0x0;
    lVar8 = -0x60;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_00b02ef8;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0);
    local_2f8._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_2d8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_2d8,local_2d8._M_head_impl);
    }
    goto LAB_0050abcc;
  case kRayQueryKHR:
    local_2f8._0_8_ = this->context_;
    local_2a8._0_4_ = 0x1178;
    break;
  case kHitObjectNV:
    local_2f8._0_8_ = this->context_;
    local_2a8._0_4_ = 0x14a1;
    break;
  case kTensorLayoutNV:
    iVar4 = (*type->_vptr_Type[0x42])(type);
    local_280._0_8_ = this->context_;
    local_258._0_4_ = 0x14fa;
    local_228._0_8_ = local_228._0_8_ & 0xffffffff00000000;
    local_328._24_8_ = local_328 + 0x10;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_22,iVar4) + 0x24))->_M_elems;
    local_328._8_8_ = 1;
    local_1f8._0_4_ = 1;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    auStack_1f0._8_8_ = (spv_operand_table)0x0;
    local_1e0._8_8_ = local_1e0;
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
               (SmallVector<unsigned_int,_2UL> *)local_328);
    local_2f8._24_8_ = local_2f8 + 0x10;
    local_2f8._0_8_ = &PTR__SmallVector_00b02ef8;
    local_2d8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2f8._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_22,iVar4) + 0x28))->_M_elems;
    local_2f8._8_8_ = (pointer)0x1;
    local_1c8 = SPV_OPERAND_TYPE_ID;
    local_1c0._0_8_ = &PTR__SmallVector_00b02ef8;
    local_1c0._8_8_ = 0;
    local_1c0._24_8_ = local_1c0 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_1a0;
    local_1a0._M_head_impl = (DefUseManager *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1c0,
               (SmallVector<unsigned_int,_2UL> *)local_2f8);
    local_2a8._8_8_ = 2;
    local_2a8._0_8_ = (IRContext *)local_1f8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2d0,(IRContext **)local_280,(Op *)local_258,(int *)local_228,
               &local_32c,(initializer_list<spvtools::opt::Operand> *)local_2a8);
    this_00 = (IRContext *)local_2d0._0_8_;
    local_2d0._0_8_ = (IRContext *)0x0;
    lVar8 = -0x60;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_00b02ef8;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0);
LAB_0050abae:
    local_2f8._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_2d8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_2d8,local_2d8._M_head_impl);
    }
LAB_0050abcc:
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_308._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_308,local_308._M_head_impl);
    }
    goto LAB_0050abe0;
  case kTensorViewNV:
    iVar4 = (*type->_vptr_Type[0x44])(type);
    lVar8 = CONCAT44(extraout_var_12,iVar4);
    local_2f8._16_4_ = (array<signed_char,_4UL>)0x0;
    local_2f8._20_4_ = (array<signed_char,_4UL>)0x0;
    local_2f8._0_8_ = (IRContext *)0x0;
    local_2f8._8_8_ = (pointer)0x0;
    local_328._24_8_ = local_328 + 0x10;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._16_4_ = *&((array<signed_char,_4UL> *)(lVar8 + 0x24))->_M_elems;
    local_328._8_8_ = 1;
    local_1f8._0_4_ = 1;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    auStack_1f0._8_8_ = (spv_operand_table)0x0;
    local_1e0._8_8_ = local_1e0;
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
               (SmallVector<unsigned_int,_2UL> *)local_328);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_2f8,
               (Operand *)local_1f8);
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_1d0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_1d0,local_1d0._M_head_impl);
    }
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_308._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_308,local_308._M_head_impl);
    }
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    local_328._24_8_ = local_328 + 0x10;
    local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._16_4_ = *&((array<signed_char,_4UL> *)(lVar8 + 0x28))->_M_elems;
    local_328._8_8_ = 1;
    local_1f8._0_4_ = 1;
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    auStack_1f0._8_8_ = (spv_operand_table)0x0;
    local_1e0._8_8_ = local_1e0;
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
               (SmallVector<unsigned_int,_2UL> *)local_328);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_2f8,
               (Operand *)local_1f8);
    auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_1d0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_1d0,local_1d0._M_head_impl);
    }
    local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_328._0_8_ = &PTR__SmallVector_00b02ef8;
    if (local_308._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_308,local_308._M_head_impl);
    }
    paVar2 = *(array<signed_char,_4UL> **)(lVar8 + 0x38);
    for (paVar7 = *(array<signed_char,_4UL> **)(lVar8 + 0x30); paVar7 != paVar2; paVar7 = paVar7 + 1
        ) {
      local_328._0_8_ = &PTR__SmallVector_00b02ef8;
      local_328._24_8_ = local_328 + 0x10;
      local_308._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_328._16_4_ = *&paVar7->_M_elems;
      local_328._8_8_ = 1;
      local_1f8._4_4_ = (undefined4)((ulong)local_1f8 >> 0x20);
      local_1f8._0_4_ = 1;
      auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
      auStack_1f0._8_8_ = (spv_operand_table)0x0;
      local_1e0._8_8_ = local_1e0;
      local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)auStack_1f0,
                 (SmallVector<unsigned_int,_2UL> *)local_328);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 local_2f8,(Operand *)local_1f8);
      auStack_1f0._0_8_ = &PTR__SmallVector_00b02ef8;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_1d0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_1d0,local_1d0._M_head_impl);
      }
      local_1d0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_328._0_8_ = &PTR__SmallVector_00b02ef8;
      if (local_308._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_308,local_308._M_head_impl);
      }
    }
    pIVar9 = this->context_;
    this_00 = (IRContext *)operator_new(0x70);
    op = OpTypeTensorViewNV;
LAB_00509ba2:
    Instruction::Instruction
              ((Instruction *)this_00,pIVar9,op,0,local_32c,
               (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_2f8)
    ;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_2f8)
    ;
    goto LAB_0050abe0;
  default:
    __assert_fail("false && \"Unexpected type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                  ,0x1ee,
                  "uint32_t spvtools::opt::analysis::TypeManager::GetTypeInstruction(const Type *)")
    ;
  }
  local_2d0._0_8_ = local_2d0._0_8_ & 0xffffffff00000000;
  local_1f8 = (undefined1  [8])0x0;
  auStack_1f0._0_8_ = (_func_int **)0x0;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)local_328,(IRContext **)local_2f8,(Op *)local_2a8,(int *)local_2d0,
             &local_32c,(initializer_list<spvtools::opt::Operand> *)local_1f8);
  this_00 = (IRContext *)local_328._0_8_;
LAB_0050abe0:
  pIVar9 = this->context_;
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(((pIVar9->module_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->types_values_)
              .super_IntrusiveList<spvtools::opt::Instruction>,(Instruction *)this_00);
  if ((pIVar9->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    DefUseManager::AnalyzeInstDefUse
              ((pIVar9->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               (((pIVar9->module_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                 .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->types_values_
               ).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
               super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
  }
  pIVar9 = this->context_;
  if ((pIVar9->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    DefUseManager::AnalyzeInstDefUse
              ((pIVar9->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               (((pIVar9->module_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                 .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->types_values_
               ).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
               super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
  }
  AttachDecorations(this,local_32c,type);
  return local_32c;
}

Assistant:

uint32_t TypeManager::GetTypeInstruction(const Type* type) {
  uint32_t id = GetId(type);
  if (id != 0) return id;

  std::unique_ptr<Instruction> typeInst;
  // TODO(1841): Handle id overflow.
  id = context()->TakeNextId();
  if (id == 0) {
    return 0;
  }

  RegisterType(id, *type);
  switch (type->kind()) {
#define DefineParameterlessCase(kind)                                         \
  case Type::k##kind:                                                         \
    typeInst = MakeUnique<Instruction>(context(), spv::Op::OpType##kind, 0,   \
                                       id, std::initializer_list<Operand>{}); \
    break
    DefineParameterlessCase(Void);
    DefineParameterlessCase(Bool);
    DefineParameterlessCase(Sampler);
    DefineParameterlessCase(Event);
    DefineParameterlessCase(DeviceEvent);
    DefineParameterlessCase(ReserveId);
    DefineParameterlessCase(Queue);
    DefineParameterlessCase(PipeStorage);
    DefineParameterlessCase(NamedBarrier);
    DefineParameterlessCase(AccelerationStructureNV);
    DefineParameterlessCase(RayQueryKHR);
    DefineParameterlessCase(HitObjectNV);
#undef DefineParameterlessCase
    case Type::kInteger:
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeInt, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {type->AsInteger()->width()}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER,
               {(type->AsInteger()->IsSigned() ? 1u : 0u)}}});
      break;
    case Type::kFloat:
      // TODO: Handle FP encoding enums once actually used.
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeFloat, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {type->AsFloat()->width()}}});
      break;
    case Type::kVector: {
      uint32_t subtype = GetTypeInstruction(type->AsVector()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst =
          MakeUnique<Instruction>(context(), spv::Op::OpTypeVector, 0, id,
                                  std::initializer_list<Operand>{
                                      {SPV_OPERAND_TYPE_ID, {subtype}},
                                      {SPV_OPERAND_TYPE_LITERAL_INTEGER,
                                       {type->AsVector()->element_count()}}});
      break;
    }
    case Type::kMatrix: {
      uint32_t subtype = GetTypeInstruction(type->AsMatrix()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst =
          MakeUnique<Instruction>(context(), spv::Op::OpTypeMatrix, 0, id,
                                  std::initializer_list<Operand>{
                                      {SPV_OPERAND_TYPE_ID, {subtype}},
                                      {SPV_OPERAND_TYPE_LITERAL_INTEGER,
                                       {type->AsMatrix()->element_count()}}});
      break;
    }
    case Type::kImage: {
      const Image* image = type->AsImage();
      uint32_t subtype = GetTypeInstruction(image->sampled_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeImage, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {subtype}},
              {SPV_OPERAND_TYPE_DIMENSIONALITY,
               {static_cast<uint32_t>(image->dim())}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {image->depth()}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER,
               {(image->is_arrayed() ? 1u : 0u)}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER,
               {(image->is_multisampled() ? 1u : 0u)}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {image->sampled()}},
              {SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT,
               {static_cast<uint32_t>(image->format())}},
              {SPV_OPERAND_TYPE_ACCESS_QUALIFIER,
               {static_cast<uint32_t>(image->access_qualifier())}}});
      break;
    }
    case Type::kSampledImage: {
      uint32_t subtype =
          GetTypeInstruction(type->AsSampledImage()->image_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeSampledImage, 0, id,
          std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {subtype}}});
      break;
    }
    case Type::kArray: {
      uint32_t subtype = GetTypeInstruction(type->AsArray()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeArray, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {subtype}},
              {SPV_OPERAND_TYPE_ID, {type->AsArray()->LengthId()}}});
      break;
    }
    case Type::kRuntimeArray: {
      uint32_t subtype =
          GetTypeInstruction(type->AsRuntimeArray()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeRuntimeArray, 0, id,
          std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {subtype}}});
      break;
    }
    case Type::kNodePayloadArrayAMDX: {
      uint32_t subtype =
          GetTypeInstruction(type->AsNodePayloadArrayAMDX()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeNodePayloadArrayAMDX, 0, id,
          std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {subtype}}});
      break;
    }
    case Type::kStruct: {
      std::vector<Operand> ops;
      const Struct* structTy = type->AsStruct();
      for (auto ty : structTy->element_types()) {
        uint32_t member_type_id = GetTypeInstruction(ty);
        if (member_type_id == 0) {
          return 0;
        }
        ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {member_type_id}));
      }
      typeInst =
          MakeUnique<Instruction>(context(), spv::Op::OpTypeStruct, 0, id, ops);
      break;
    }
    case Type::kOpaque: {
      const Opaque* opaque = type->AsOpaque();
      // Convert to null-terminated packed UTF-8 string.
      std::vector<uint32_t> words = spvtools::utils::MakeVector(opaque->name());
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeOpaque, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_LITERAL_STRING, words}});
      break;
    }
    case Type::kPointer: {
      const Pointer* pointer = type->AsPointer();
      uint32_t subtype = GetTypeInstruction(pointer->pointee_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypePointer, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_STORAGE_CLASS,
               {static_cast<uint32_t>(pointer->storage_class())}},
              {SPV_OPERAND_TYPE_ID, {subtype}}});
      break;
    }
    case Type::kFunction: {
      std::vector<Operand> ops;
      const Function* function = type->AsFunction();
      uint32_t return_type_id = GetTypeInstruction(function->return_type());
      if (return_type_id == 0) {
        return 0;
      }
      ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {return_type_id}));
      for (auto ty : function->param_types()) {
        uint32_t paramater_type_id = GetTypeInstruction(ty);
        if (paramater_type_id == 0) {
          return 0;
        }
        ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {paramater_type_id}));
      }
      typeInst = MakeUnique<Instruction>(context(), spv::Op::OpTypeFunction, 0,
                                         id, ops);
      break;
    }
    case Type::kPipe:
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypePipe, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ACCESS_QUALIFIER,
               {static_cast<uint32_t>(type->AsPipe()->access_qualifier())}}});
      break;
    case Type::kForwardPointer:
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeForwardPointer, 0, 0,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {type->AsForwardPointer()->target_id()}},
              {SPV_OPERAND_TYPE_STORAGE_CLASS,
               {static_cast<uint32_t>(
                   type->AsForwardPointer()->storage_class())}}});
      break;
    case Type::kCooperativeMatrixNV: {
      auto coop_mat = type->AsCooperativeMatrixNV();
      uint32_t const component_type =
          GetTypeInstruction(coop_mat->component_type());
      if (component_type == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeCooperativeMatrixNV, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {component_type}},
              {SPV_OPERAND_TYPE_SCOPE_ID, {coop_mat->scope_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->rows_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->columns_id()}}});
      break;
    }
    case Type::kCooperativeMatrixKHR: {
      auto coop_mat = type->AsCooperativeMatrixKHR();
      uint32_t const component_type =
          GetTypeInstruction(coop_mat->component_type());
      if (component_type == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeCooperativeMatrixKHR, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {component_type}},
              {SPV_OPERAND_TYPE_SCOPE_ID, {coop_mat->scope_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->rows_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->columns_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->use_id()}}});
      break;
    }
    case Type::kTensorLayoutNV: {
      auto tensor_layout = type->AsTensorLayoutNV();
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeTensorLayoutNV, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {tensor_layout->dim_id()}},
              {SPV_OPERAND_TYPE_ID, {tensor_layout->clamp_mode_id()}}});
      break;
    }
    case Type::kTensorViewNV: {
      auto tensor_view = type->AsTensorViewNV();
      std::vector<Operand> operands;
      operands.push_back(Operand{SPV_OPERAND_TYPE_ID, {tensor_view->dim_id()}});
      operands.push_back(
          Operand{SPV_OPERAND_TYPE_ID, {tensor_view->has_dimensions_id()}});
      for (auto p : tensor_view->perm()) {
        operands.push_back(Operand{SPV_OPERAND_TYPE_ID, {p}});
      }
      typeInst = MakeUnique<Instruction>(context(), spv::Op::OpTypeTensorViewNV,
                                         0, id, operands);
      break;
    }
    case Type::kCooperativeVectorNV: {
      auto coop_vec = type->AsCooperativeVectorNV();
      uint32_t const component_type =
          GetTypeInstruction(coop_vec->component_type());
      if (component_type == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeCooperativeVectorNV, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {component_type}},
              {SPV_OPERAND_TYPE_ID, {coop_vec->components()}}});
      break;
    }
    default:
      assert(false && "Unexpected type");
      break;
  }
  context()->AddType(std::move(typeInst));
  context()->AnalyzeDefUse(&*--context()->types_values_end());
  AttachDecorations(id, type);
  return id;
}